

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1dbda9e::TransitiveLinkImpl::Follow
          (TransitiveLinkImpl *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  PolicyStatus PVar2;
  cmLinkInterfaceLibraries *pcVar3;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1;
  cmLinkItem *item;
  pointer pcVar4;
  pair<std::__detail::_Node_iterator<const_cmGeneratorTarget_*,_true,_false>,_bool> pVar5;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar6;
  __node_gen_type __node_gen;
  cmGeneratorTarget *local_40;
  _Hashtable<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>,std::__detail::_Identity,std::equal_to<cmGeneratorTarget_const*>,std::hash<cmGeneratorTarget_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  if (target != (cmGeneratorTarget *)0x0) {
    local_38 = (_Hashtable<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>,std::__detail::_Identity,std::equal_to<cmGeneratorTarget_const*>,std::hash<cmGeneratorTarget_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->Followed;
    local_40 = target;
    pVar5 = std::
            _Hashtable<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>,std::__detail::_Identity,std::equal_to<cmGeneratorTarget_const*>,std::hash<cmGeneratorTarget_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<cmGeneratorTarget_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<cmGeneratorTarget_const*,false>>>>
                      (local_38,&local_40);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      PVar2 = cmPolicies::PolicyMap::Get(&local_40->PolicyMap,CMP0022);
      if (PVar2 != OLD) {
        PVar2 = cmPolicies::PolicyMap::Get(&local_40->PolicyMap,CMP0022);
        if (PVar2 != WARN) {
          pcVar3 = cmGeneratorTarget::GetLinkInterfaceLibraries
                             (local_40,this->Config,this->Self,this->ImplFor);
          if (pcVar3 != (cmLinkInterfaceLibraries *)0x0) {
            if (pcVar3->HadContextSensitiveCondition == true) {
              (this->Impl->super_cmLinkImplementationLibraries).HadContextSensitiveCondition = true;
            }
            pcVar4 = (pcVar3->HeadInclude).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar1 = (pcVar3->HeadInclude).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar4 != pcVar1) {
              do {
                Follow(this,pcVar4->Target);
                pVar6 = std::
                        _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                        ::_M_insert_unique<cmLinkItem_const&>
                                  ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                                    *)&this->Emitted,pcVar4);
                if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  local_38 = (_Hashtable<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>,std::__detail::_Identity,std::equal_to<cmGeneratorTarget_const*>,std::hash<cmGeneratorTarget_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)((ulong)local_38 & 0xffffffffffffff00);
                  std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
                  emplace_back<cmLinkItem_const&,bool>
                            ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)this->Impl,
                             pcVar4,(bool *)&local_38);
                }
                pcVar4 = pcVar4 + 1;
              } while (pcVar4 != pcVar1);
            }
            pcVar1 = (pcVar3->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pcVar4 = (pcVar3->Libraries).
                          super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                          super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
              Follow(this,pcVar4->Target);
            }
            pcVar4 = (pcVar3->HeadExclude).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar1 = (pcVar3->HeadExclude).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar4 != pcVar1) {
              do {
                std::
                _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                ::_M_insert_unique<cmLinkItem_const&>
                          ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                            *)&this->Excluded,pcVar4);
                pcVar4 = pcVar4 + 1;
              } while (pcVar4 != pcVar1);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TransitiveLinkImpl::Follow(cmGeneratorTarget const* target)
{
  if (!target || !this->Followed.insert(target).second ||
      target->GetPolicyStatusCMP0022() == cmPolicies::OLD ||
      target->GetPolicyStatusCMP0022() == cmPolicies::WARN) {
    return;
  }

  // Get this target's usage requirements.
  cmLinkInterfaceLibraries const* iface =
    target->GetLinkInterfaceLibraries(this->Config, this->Self, this->ImplFor);
  if (!iface) {
    return;
  }
  if (iface->HadContextSensitiveCondition) {
    this->Impl.HadContextSensitiveCondition = true;
  }

  // Process 'INTERFACE_LINK_LIBRARIES_DIRECT' usage requirements.
  for (cmLinkItem const& item : iface->HeadInclude) {
    // Inject direct dependencies from the item's usage requirements
    // before the item itself.
    this->Follow(item.Target);

    // Add the item itself, but at most once.
    if (this->Emitted.insert(item).second) {
      this->Impl.Libraries.emplace_back(item, /* checkCMP0027= */ false);
    }
  }

  // Follow transitive dependencies.
  for (cmLinkItem const& item : iface->Libraries) {
    this->Follow(item.Target);
  }

  // Record exclusions from 'INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE'
  // usage requirements.
  for (cmLinkItem const& item : iface->HeadExclude) {
    this->Excluded.insert(item);
  }
}